

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  long *plVar1;
  Expr<tcu::Vector<float,_4>_> *pEVar2;
  undefined7 uVar3;
  pointer pSVar4;
  IVal *pIVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  IRet *pIVar9;
  Vector<tcu::Interval,_4> *pVVar10;
  byte bVar11;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  _Stack_108;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  YesNoMaybe YStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  Precision local_b0;
  undefined1 *local_a8;
  int local_a0;
  double local_90 [12];
  
  bVar11 = 0;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_108._M_impl.super__Rb_tree_header._M_header;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar6 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar6 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar6) = 0xfff0000000000000;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x70);
  lVar6 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar6 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar6 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar6) = 0xfff0000000000000;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x70);
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left;
  initialize(this);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&_Stack_108,
             (this->m_var0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             args->a);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&_Stack_108,
             (this->m_var1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             args->b);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&_Stack_108,
             (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             args->c);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->d);
  local_b0 = ctx->floatPrecision;
  local_a0 = ctx->callDepth;
  local_b8 = (ctx->format).m_maxValue;
  local_d8 = (ctx->format).m_minExp;
  iStack_d4 = (ctx->format).m_maxExp;
  iStack_d0 = (ctx->format).m_fractionBits;
  YStack_cc = (ctx->format).m_hasSubnormal;
  local_c8._0_4_ = (ctx->format).m_hasInf;
  local_c8._4_4_ = (ctx->format).m_hasNaN;
  uStack_c0 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  pSVar4 = (this->m_body).
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (undefined1 *)&_Stack_108;
  if ((this->m_body).
      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar4) {
    lVar6 = 0;
    uVar7 = 0;
    local_a8 = (undefined1 *)&_Stack_108;
    do {
      plVar1 = *(long **)((long)&(pSVar4->super_SharedPtr<const_vkt::shaderexecutor::Statement>).
                                 m_ptr + lVar6);
      (**(code **)(*plVar1 + 0x18))(plVar1,&local_d8);
      uVar7 = uVar7 + 1;
      pSVar4 = (this->m_body).
               super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->m_body).
                                   super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 4));
  }
  pEVar2 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_4>_>.
           super_ExprPBase<tcu::Vector<float,_4>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(local_90,pEVar2,&local_d8);
  pdVar8 = local_90;
  pIVar9 = __return_storage_ptr__;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(double *)pIVar9->m_data = *pdVar8;
    pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
    pIVar9 = (IRet *)((long)pIVar9 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pIVar5 = Environment::lookup<tcu::Vector<float,4>>
                     ((Environment *)&_Stack_108,
                      (this->m_var0).
                      super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                      m_ptr);
  pVVar10 = args->a;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar3 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
    pVVar10->m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar10->m_data[0].field_0x1 = uVar3;
    pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar11 * -2 + 1) * 8);
    pVVar10 = (Vector<tcu::Interval,_4> *)((long)pVVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pIVar5 = Environment::lookup<tcu::Vector<float,4>>
                     ((Environment *)&_Stack_108,
                      (this->m_var1).
                      super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                      m_ptr);
  pVVar10 = args->b;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar3 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
    pVVar10->m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar10->m_data[0].field_0x1 = uVar3;
    pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar11 * -2 + 1) * 8);
    pVVar10 = (Vector<tcu::Interval,_4> *)((long)pVVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pIVar5 = Environment::lookup<tcu::Vector<float,4>>
                     ((Environment *)&_Stack_108,
                      (this->m_var2).
                      super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                      m_ptr);
  pVVar10 = args->c;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar3 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
    pVVar10->m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar10->m_data[0].field_0x1 = uVar3;
    pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar11 * -2 + 1) * 8);
    pVVar10 = (Vector<tcu::Interval,_4> *)((long)pVVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&_Stack_108);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}